

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::Literal*>::loadFromIterator<Lib::VirtualIterator<Kernel::Literal*>>
          (Stack<Kernel::Literal*> *this,VirtualIterator<Kernel::Literal_*> *it)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 *puVar2;
  IteratorCore<Kernel::Literal_*> *pIVar3;
  
  pIVar3 = it->_core;
  while( true ) {
    iVar1 = (*pIVar3->_vptr_IteratorCore[2])();
    if ((char)iVar1 == '\0') break;
    iVar1 = (*it->_core->_vptr_IteratorCore[3])();
    puVar2 = *(undefined8 **)(this + 0x10);
    if (puVar2 == *(undefined8 **)(this + 0x18)) {
      Stack<Kernel::Literal_*>::expand((Stack<Kernel::Literal_*> *)this);
      puVar2 = *(undefined8 **)(this + 0x10);
    }
    *puVar2 = CONCAT44(extraout_var,iVar1);
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 8;
    pIVar3 = it->_core;
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }